

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCaseInstance::uploadImage
          (ShaderRenderCaseInstance *this,TextureFormat *texFormat,TextureData *textureData,
          Sampler *refSampler,deUint32 mipLevels,deUint32 arrayLayers,VkImage destImage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Allocator *pAVar4;
  Handle<(vk::HandleType)24> commandPool;
  Handle<(vk::HandleType)24> HVar5;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  VkAllocationCallbacks *pVVar8;
  undefined8 buffer;
  uint uVar9;
  int iVar10;
  VkResult VVar11;
  deUint32 dVar12;
  pointer pvVar13;
  pointer pvVar14;
  VkQueue pVVar15;
  ConstPixelBufferAccess *access;
  pointer pCVar16;
  ulong uVar17;
  deUint32 dVar18;
  long lVar19;
  TextureFormat *format;
  VkDevice pVVar20;
  ulong uVar21;
  long *plVar22;
  DeviceDriver *local_2c0;
  ulong local_2b8;
  VkCommandBuffer local_2a8;
  DeviceInterface *pDStack_2a0;
  VkDevice local_298;
  VkAllocationCallbacks *pVStack_290;
  Move<vk::Handle<(vk::HandleType)24>_> local_288;
  undefined8 local_268;
  deUint64 local_260;
  uint local_258;
  undefined4 local_254;
  deUint32 local_250;
  undefined4 local_24c;
  deUint32 local_248;
  VkDevice local_238;
  TextureData *local_230;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copyRegions;
  VkBufferCreateInfo bufferParams;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_180;
  VkFence local_168;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_160;
  VkSubmitInfo submitInfo;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_f0;
  ulong local_d0;
  long *local_c8;
  VkQueue local_c0;
  long local_b8;
  undefined4 local_b0 [2];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [24];
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  PixelBufferAccess destAccess;
  
  local_230 = textureData;
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    local_238 = (((this->m_sparseContext).
                  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                  .m_data.ptr)->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
LAB_0062a30c:
    local_2c0 = &((this->m_sparseContext).
                  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                  .m_data.ptr)->m_deviceInterface;
LAB_0062a319:
    pVVar15 = ((this->m_sparseContext).
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.ptr)->m_queue;
  }
  else {
    local_238 = Context::getDevice((this->super_TestInstance).m_context);
    if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) goto LAB_0062a30c;
    local_2c0 = (DeviceDriver *)Context::getDeviceInterface((this->super_TestInstance).m_context);
    if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) goto LAB_0062a319;
    pVVar15 = Context::getUniversalQueue((this->super_TestInstance).m_context);
    if (this->m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE) {
      dVar12 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
      goto LAB_0062a32b;
    }
  }
  dVar12 = ((this->m_sparseContext).
            super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
            .m_data.ptr)->m_queueFamilyIndex;
LAB_0062a32b:
  uVar9 = 2 - (refSampler->compare == COMPAREMODE_NONE);
  DStack_180.m_device = (VkDevice)0x0;
  DStack_180.m_allocator = (VkAllocationCallbacks *)0x0;
  DStack_180.m_deviceIface = (DeviceInterface *)0x0;
  DStack_f0.m_device = (VkDevice)0x0;
  DStack_f0.m_allocator = (VkAllocationCallbacks *)0x0;
  DStack_f0.m_deviceIface = (DeviceInterface *)0x0;
  local_298 = (VkDevice)0x0;
  pVStack_290 = (VkAllocationCallbacks *)0x0;
  local_2a8 = (VkCommandBuffer)0x0;
  pDStack_2a0 = (DeviceInterface *)0x0;
  DStack_160.m_device = (VkDevice)0x0;
  DStack_160.m_allocator = (VkAllocationCallbacks *)0x0;
  local_168.m_internal = 0;
  DStack_160.m_deviceIface = (DeviceInterface *)0x0;
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bufferParams.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&offsetMultiples,(iterator)0x0,&bufferParams.sType);
  bufferParams.sType = tcu::TextureFormat::getPixelSize(texFormat);
  pVVar20 = local_238;
  if (offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&offsetMultiples,
               (iterator)
               offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,&bufferParams.sType);
  }
  else {
    *offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = bufferParams.sType;
    offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  pvVar14 = (local_230->
            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar13 = (local_230->
            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_c0 = pVVar15;
  if (pvVar14 == pvVar13) {
    bufferParams.size = 0;
  }
  else {
    dVar18 = 0;
    do {
      pCVar16 = (pvVar14->
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pCVar16 !=
          (pvVar14->
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          dVar18 = sr::anon_unknown_0::getNextMultiple
                             ((anon_unknown_0 *)
                              offsetMultiples.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              offsetMultiples.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish,dVar18);
          iVar1 = (pCVar16->m_size).m_data[0];
          iVar2 = (pCVar16->m_size).m_data[1];
          iVar3 = (pCVar16->m_size).m_data[2];
          iVar10 = tcu::TextureFormat::getPixelSize(&pCVar16->m_format);
          dVar18 = iVar3 * iVar10 * iVar2 * iVar1 + dVar18;
          pCVar16 = pCVar16 + 1;
        } while (pCVar16 !=
                 (pvVar14->
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
        pvVar13 = (local_230->
                  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      pvVar14 = pvVar14 + 1;
    } while (pvVar14 != pvVar13);
    bufferParams.size = (VkDeviceSize)dVar18;
    pVVar20 = local_238;
  }
  bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.pNext = (void *)0x0;
  bufferParams._16_8_ = (ulong)(uint)bufferParams._20_4_ << 0x20;
  bufferParams.usage = 1;
  bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferParams._40_8_ = (ulong)(uint)bufferParams._44_4_ << 0x20;
  bufferParams.pQueueFamilyIndices = (deUint32 *)0x0;
  local_d0 = bufferParams.size;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&submitInfo,
                     &local_2c0->super_DeviceInterface,pVVar20,&bufferParams,
                     (VkAllocationCallbacks *)0x0);
  buffer = submitInfo._0_8_;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = buffer;
  pAVar4 = this->m_memAlloc;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&local_288,&local_2c0->super_DeviceInterface,pVVar20,
             (VkBuffer)buffer);
  (*pAVar4->_vptr_Allocator[3])(&submitInfo,pAVar4,&local_288,1);
  plVar22 = (long *)submitInfo._0_8_;
  VVar11 = (*(local_2c0->super_DeviceInterface)._vptr_DeviceInterface[0xc])
                     (local_2c0,pVVar20,buffer,*(undefined8 *)(submitInfo._0_8_ + 8),
                      *(undefined8 *)(submitInfo._0_8_ + 0x10));
  ::vk::checkResult(VVar11,
                    "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x440);
  ::vk::createCommandPool
            (&local_288,&local_2c0->super_DeviceInterface,pVVar20,1,dVar12,
             (VkAllocationCallbacks *)0x0);
  commandPool.m_internal =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_288,&local_2c0->super_DeviceInterface,pVVar20,
             (VkCommandPool)commandPool.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pVVar8 = local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  pVVar7 = local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pDVar6 = local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  bufferParams._16_8_ =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  bufferParams.size =
       (VkDeviceSize)
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  bufferParams._0_8_ =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  bufferParams.pNext =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_2a8 == (VkCommandBuffer)0x0) {
    local_298 = pVVar7;
    pVStack_290 = pVVar8;
    local_2a8 = (VkCommandBuffer)HVar5.m_internal;
    pDStack_2a0 = pDVar6;
  }
  else {
    submitInfo._0_8_ = local_2a8;
    (**(code **)(*(long *)pDStack_2a0 + 0x240))(pDStack_2a0,local_298,pVStack_290);
    local_2a8 = (VkCommandBuffer)bufferParams._0_8_;
    pDStack_2a0 = (DeviceInterface *)bufferParams.pNext;
    local_298 = (VkDevice)bufferParams._16_8_;
    pVStack_290 = (VkAllocationCallbacks *)bufferParams.size;
    if (local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      bufferParams._0_8_ =
           local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
      (*(local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x48])
                (local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_deviceIface,
                 local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
                 local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
                );
    }
  }
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_288,
                    &local_2c0->super_DeviceInterface,pVVar20,0,(VkAllocationCallbacks *)0x0);
  pVVar8 = local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  pVVar20 = local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pDVar6 = local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  bufferParams._16_8_ =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  bufferParams.size =
       (VkDeviceSize)
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  bufferParams._0_8_ =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  bufferParams.pNext =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_168.m_internal == 0) {
    DStack_160.m_device = pVVar20;
    DStack_160.m_allocator = pVVar8;
    local_168.m_internal = HVar5.m_internal;
    DStack_160.m_deviceIface = pDVar6;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_160,local_168);
    local_168.m_internal = bufferParams._0_8_;
    DStack_160.m_deviceIface = (DeviceInterface *)bufferParams.pNext;
    DStack_160.m_device = (VkDevice)bufferParams._16_8_;
    DStack_160.m_allocator = (VkAllocationCallbacks *)bufferParams.size;
    if (local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
                 &local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                 (VkFence)local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                          m_internal);
    }
  }
  local_b0[0] = 0x2c;
  dVar12 = 0;
  local_a8 = 0;
  local_a0 = 0x80000004000;
  uStack_98 = 0xffffffffffffffff;
  local_90._0_8_ = buffer;
  local_90._8_8_ = 0;
  local_90._16_8_ = local_d0;
  bufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferParams.pNext = (void *)0x0;
  bufferParams.flags = 0;
  bufferParams._20_4_ = 0x1000;
  bufferParams.size = 0x700000000;
  bufferParams.usage = 0xffffffff;
  bufferParams.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferParams._40_8_ = destImage.m_internal;
  bufferParams.pQueueFamilyIndices = (deUint32 *)(ulong)uVar9;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ = 0x2d;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x2000001000;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x500000007;
  local_268 = 0xffffffffffffffff;
  local_260 = destImage.m_internal;
  local_254 = 0;
  local_24c = 0;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  pvVar14 = (local_230->
            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar13 = (local_230->
            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_258 = uVar9;
  local_250 = mipLevels;
  local_248 = arrayLayers;
  if (pvVar13 != pvVar14) {
    local_b8 = *(long *)((long)plVar22 + 0x18);
    uVar17 = 0;
    local_c8 = plVar22;
    do {
      pCVar16 = pvVar14[uVar17].
                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pvVar14[uVar17].
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_finish != pCVar16) {
        lVar19 = 8;
        local_2b8 = 0;
        do {
          dVar12 = sr::anon_unknown_0::getNextMultiple
                             ((anon_unknown_0 *)
                              offsetMultiples.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              offsetMultiples.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish,dVar12);
          format = (TextureFormat *)((long)(pCVar16->m_size).m_data + lVar19 + -0x10);
          uVar21 = (ulong)dVar12;
          tcu::PixelBufferAccess::PixelBufferAccess
                    (&destAccess,format,(IVec3 *)((long)(pCVar16->m_size).m_data + lVar19 + -8),
                     (void *)(local_b8 + uVar21));
          submitInfo.pNext =
               (void *)CONCAT44(*(undefined4 *)((long)(pCVar16->m_size).m_data + lVar19 + -4),
                                *(undefined4 *)((long)(pCVar16->m_size).m_data + lVar19 + -8));
          submitInfo._20_4_ = (int)uVar17;
          submitInfo.waitSemaphoreCount = uVar9;
          submitInfo.pWaitSemaphores._0_4_ = (undefined4)local_2b8;
          submitInfo.pWaitSemaphores._4_4_ = 1;
          submitInfo.pWaitDstStageMask._0_4_ = 0;
          submitInfo.pWaitDstStageMask._4_4_ = 0;
          submitInfo.commandBufferCount = 0;
          submitInfo._44_4_ = *(uint *)((long)(pCVar16->m_size).m_data + lVar19 + -8);
          submitInfo.pCommandBuffers =
               (VkCommandBuffer *)
               CONCAT44(*(undefined4 *)((long)(pCVar16->m_size).m_data + lVar19),
                        *(undefined4 *)((long)(pCVar16->m_size).m_data + lVar19 + -4));
          submitInfo._0_8_ = uVar21;
          if (copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>>::
            _M_realloc_insert<vk::VkBufferImageCopy_const&>
                      ((vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>> *)
                       &copyRegions,
                       (iterator)
                       copyRegions.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(VkBufferImageCopy *)&submitInfo);
          }
          else {
            *(VkCommandBuffer **)
             &((copyRegions.
                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                _M_impl.super__Vector_impl_data._M_finish)->imageExtent).height =
                 submitInfo.pCommandBuffers;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageOffset).x = 0;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageOffset).y = 0;
            *(ulong *)&((copyRegions.
                         super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->imageOffset).z =
                 (ulong)(uint)submitInfo._44_4_ << 0x20;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).aspectMask = uVar9;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).mipLevel = (int)uVar17;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).baseArrayLayer =
                 submitInfo.pWaitSemaphores._0_4_;
            ((copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).layerCount = 1;
            (copyRegions.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_finish)->bufferOffset = uVar21;
            *(void **)&(copyRegions.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->bufferRowLength =
                 submitInfo.pNext;
            copyRegions.
            super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 copyRegions.
                 super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          tcu::copy((EVP_PKEY_CTX *)&destAccess,(EVP_PKEY_CTX *)format);
          iVar1 = *(int *)((long)(pCVar16->m_size).m_data + lVar19 + -8);
          iVar2 = *(int *)((long)(pCVar16->m_size).m_data + lVar19 + -4);
          iVar3 = *(int *)((long)(pCVar16->m_size).m_data + lVar19);
          iVar10 = tcu::TextureFormat::getPixelSize(format);
          dVar12 = iVar3 * iVar10 * iVar2 * iVar1 + dVar12;
          local_2b8 = local_2b8 + 1;
          pCVar16 = pvVar14[uVar17].
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = lVar19 + 0x28;
        } while (local_2b8 <
                 (ulong)(((long)pvVar14[uVar17].
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar16 >> 3) *
                        -0x3333333333333333));
        pvVar14 = (local_230->
                  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pvVar13 = (local_230->
                  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        plVar22 = local_c8;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)(((long)pvVar13 - (long)pvVar14 >> 3) * -0x5555555555555555));
  }
  pVVar20 = local_238;
  ::vk::flushMappedMemoryRange
            (&local_2c0->super_DeviceInterface,local_238,(VkDeviceMemory)plVar22[1],plVar22[2],
             local_d0);
  VVar11 = (*(local_2c0->super_DeviceInterface)._vptr_DeviceInterface[0x49])
                     (local_2c0,local_2a8,&cmdBufferBeginInfo);
  ::vk::checkResult(VVar11,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4b6);
  (*(local_2c0->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (local_2c0,local_2a8,0x4000,0x1000,0,0,0,1,local_b0,1,&bufferParams);
  (*(local_2c0->super_DeviceInterface)._vptr_DeviceInterface[0x62])
            (local_2c0,local_2a8,buffer,destImage.m_internal,7,
             (ulong)(uint)((int)((ulong)((long)copyRegions.
                                               super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)copyRegions.
                                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x49249249),
             copyRegions.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (*(local_2c0->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (local_2c0,local_2a8,0x1000,1,0,0,0,0,0,1,&local_288);
  VVar11 = (*(local_2c0->super_DeviceInterface)._vptr_DeviceInterface[0x4a])(local_2c0,local_2a8);
  ::vk::checkResult(VVar11,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4ba);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask._0_4_ = 0;
  submitInfo.pWaitDstStageMask._4_4_ = 0;
  submitInfo._44_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo.pCommandBuffers = &local_2a8;
  VVar11 = (*(local_2c0->super_DeviceInterface)._vptr_DeviceInterface[2])
                     (local_2c0,local_c0,1,&submitInfo,local_168.m_internal);
  ::vk::checkResult(VVar11,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4c9);
  VVar11 = (*(local_2c0->super_DeviceInterface)._vptr_DeviceInterface[0x16])
                     (local_2c0,pVVar20,1,&local_168,1,0xffffffffffffffff);
  ::vk::checkResult(VVar11,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4ca);
  if (offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)offsetMultiples.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)offsetMultiples.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(copyRegions.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_160,local_168);
  }
  if (local_2a8 != (VkCommandBuffer)0x0) {
    bufferParams._0_8_ = local_2a8;
    (*pDStack_2a0->_vptr_DeviceInterface[0x48])(pDStack_2a0,local_298,pVStack_290,1);
  }
  if (commandPool.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_f0,(VkCommandPool)commandPool.m_internal);
  }
  (**(code **)(*plVar22 + 8))(plVar22);
  if (buffer != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_180,(VkBuffer)buffer);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::uploadImage (const tcu::TextureFormat&			texFormat,
											const TextureData&					textureData,
											const tcu::Sampler&					refSampler,
											deUint32							mipLevels,
											deUint32							arrayLayers,
											VkImage								destImage)
{
	const VkDevice					vkDevice				= getDevice();
	const DeviceInterface&			vk						= getDeviceInterface();
	const VkQueue					queue					= getUniversalQueue();
	const deUint32					queueFamilyIndex		= getUniversalQueueFamilyIndex();

	const bool						isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	deUint32						bufferSize				= 0u;
	Move<VkBuffer>					buffer;
	de::MovePtr<Allocation>			bufferAlloc;
	Move<VkCommandPool>				cmdPool;
	Move<VkCommandBuffer>			cmdBuffer;
	Move<VkFence>					fence;
	std::vector<VkBufferImageCopy>	copyRegions;
	std::vector<deUint32>			offsetMultiples;

	offsetMultiples.push_back(4u);
	offsetMultiples.push_back(texFormat.getPixelSize());

	// Calculate buffer size
	for (TextureData::const_iterator mit = textureData.begin(); mit != textureData.end(); ++mit)
	{
		for (TextureLayerData::const_iterator lit = mit->begin(); lit != mit->end(); ++lit)
		{
			const tcu::ConstPixelBufferAccess&	access	= *lit;

			bufferSize = getNextMultiple(offsetMultiples, bufferSize);
			bufferSize += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
		}
	}

	// Create source buffer
	{
		const VkBufferCreateInfo bufferParams =
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			bufferSize,									// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			0u,											// deUint32				queueFamilyIndexCount;
			DE_NULL,									// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, vkDevice, &bufferParams);
		bufferAlloc = m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));
	}

	// Create command pool and buffer
	cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);
	cmdBuffer = allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	fence = createFence(vk, vkDevice);

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier preBufferBarrier =
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		bufferSize									// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// Get copy regions and write buffer data
	{
		deUint32	layerDataOffset		= 0;
		deUint8*	destPtr				= (deUint8*)bufferAlloc->getHostPtr();

		for (size_t levelNdx = 0; levelNdx < textureData.size(); levelNdx++)
		{
			const TextureLayerData&		layerData	= textureData[levelNdx];

			for (size_t layerNdx = 0; layerNdx < layerData.size(); layerNdx++)
			{
				layerDataOffset = getNextMultiple(offsetMultiples, layerDataOffset);

				const tcu::ConstPixelBufferAccess&	access		= layerData[layerNdx];
				const tcu::PixelBufferAccess		destAccess	(access.getFormat(), access.getSize(), destPtr + layerDataOffset);

				const VkBufferImageCopy				layerRegion =
				{
					layerDataOffset,						// VkDeviceSize				bufferOffset;
					(deUint32)access.getWidth(),			// deUint32					bufferRowLength;
					(deUint32)access.getHeight(),			// deUint32					bufferImageHeight;
					{										// VkImageSubresourceLayers	imageSubresource;
						aspectMask,								// VkImageAspectFlags		aspectMask;
						(deUint32)levelNdx,						// uint32_t					mipLevel;
						(deUint32)layerNdx,						// uint32_t					baseArrayLayer;
						1u										// uint32_t					layerCount;
					},
					{ 0u, 0u, 0u },							// VkOffset3D			imageOffset;
					{										// VkExtent3D			imageExtent;
						(deUint32)access.getWidth(),
						(deUint32)access.getHeight(),
						(deUint32)access.getDepth()
					}
				};

				copyRegions.push_back(layerRegion);
				tcu::copy(destAccess, access);

				layerDataOffset += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
			}
		}
	}

	flushMappedMemoryRange(vk, vkDevice, bufferAlloc->getMemory(), bufferAlloc->getOffset(), bufferSize);

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &preBufferBarrier, 1, &preImageBarrier);
	vk.cmdCopyBufferToImage(*cmdBuffer, *buffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copyRegions.size(), copyRegions.data());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
		DE_NULL,						// const void*					pNext;
		0u,								// deUint32						waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,								// deUint32						commandBufferCount;
		&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
		0u,								// deUint32						signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
}